

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O1

int archive_read_support_format_ar(archive *_a)

{
  int iVar1;
  void *format_data;
  int iVar2;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_ar");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    format_data = calloc(1,0x38);
    if (format_data == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate ar data");
    }
    else {
      *(undefined8 *)((long)format_data + 0x20) = 0;
      iVar1 = __archive_read_register_format
                        ((archive_read *)_a,format_data,"ar",archive_read_format_ar_bid,
                         (_func_int_archive_read_ptr_char_ptr_char_ptr *)0x0,
                         archive_read_format_ar_read_header,archive_read_format_ar_read_data,
                         archive_read_format_ar_skip,
                         (_func_int64_t_archive_read_ptr_int64_t_int *)0x0,
                         archive_read_format_ar_cleanup,(_func_int_archive_read_ptr *)0x0,
                         (_func_int_archive_read_ptr *)0x0);
      iVar2 = 0;
      if (iVar1 != 0) {
        free(format_data);
        iVar2 = iVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

int
archive_read_support_format_ar(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct ar *ar;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_ar");

	ar = (struct ar *)calloc(1, sizeof(*ar));
	if (ar == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ar data");
		return (ARCHIVE_FATAL);
	}
	ar->strtab = NULL;

	r = __archive_read_register_format(a,
	    ar,
	    "ar",
	    archive_read_format_ar_bid,
	    NULL,
	    archive_read_format_ar_read_header,
	    archive_read_format_ar_read_data,
	    archive_read_format_ar_skip,
	    NULL,
	    archive_read_format_ar_cleanup,
	    NULL,
	    NULL);

	if (r != ARCHIVE_OK) {
		free(ar);
		return (r);
	}
	return (ARCHIVE_OK);
}